

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi,void **scanResults,int *count)

{
  byte bVar1;
  PaUtilAllocationGroup *pPVar2;
  char *pcVar3;
  PaDeviceInfo **deviceInfos;
  long lVar4;
  long lVar5;
  snd_ctl_t *psVar6;
  byte *pbVar7;
  PaAlsaHostApiRepresentation *pPVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined8 uVar21;
  pthread_t __thread1;
  PaAlsaDeviceInfo *pPVar22;
  void *pvVar23;
  PaAlsaDeviceInfo *pPVar24;
  byte *pbVar25;
  int __pa_unsure_error_id;
  HwDevInfo *pHVar26;
  char **ppcVar27;
  char *pcVar28;
  char *pcVar29;
  char *__s;
  byte *pbVar30;
  PaAlsaDeviceInfo *pPVar31;
  bool bVar32;
  undefined8 uStack_160;
  char local_158 [8];
  char alsaCardName [50];
  char *local_118;
  char buf [67];
  char *alsaDeviceName;
  char *local_b0;
  undefined8 local_a8;
  snd_config_t *topNode;
  char *local_98;
  PaAlsaDeviceInfo *local_90;
  int local_88;
  uint local_84;
  int cardIdx;
  char *cardName;
  snd_ctl_t *ctl;
  int local_64;
  uint uStack_60;
  int devIdx_1;
  int local_54;
  PaAlsaDeviceInfo *pPStack_50;
  int devIdx;
  PaAlsaHostApiRepresentation *local_48;
  HwDevInfo *local_40;
  ulong local_38;
  
  local_88 = -1;
  local_54 = 0;
  local_a8 = 0;
  uStack_160 = 0x1147f0;
  pcVar13 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar13 == (char *)0x0) {
    local_84 = 1;
  }
  else {
    uStack_160 = 0x1147fd;
    iVar9 = atoi(pcVar13);
    local_84 = (uint)(iVar9 == 0);
  }
  uStack_160 = 0x11481c;
  pcVar13 = getenv("PA_ALSA_PLUGHW");
  local_38 = 0;
  if (pcVar13 == (char *)0x0) {
    local_b0 = "";
    topNode._4_4_ = 0;
  }
  else {
    uStack_160 = 0x114838;
    iVar9 = atoi(pcVar13);
    topNode._4_4_ = (uint)(iVar9 != 0);
    local_b0 = "";
    if (iVar9 != 0) {
      local_b0 = "plug";
    }
  }
  local_88 = -1;
  uStack_160 = 0x114887;
  sVar14 = snd_ctl_card_info_sizeof();
  lVar4 = -(sVar14 + 0xf & 0xfffffffffffffff0);
  pcVar13 = local_158 + lVar4;
  pcVar28 = local_158 + lVar4 + -8;
  pcVar28[0] = -0x57;
  pcVar28[1] = 'H';
  pcVar28[2] = '\x11';
  pcVar28[3] = '\0';
  pcVar28[4] = '\0';
  pcVar28[5] = '\0';
  pcVar28[6] = '\0';
  pcVar28[7] = '\0';
  memset(pcVar13,0,sVar14);
  pcVar29 = local_158 + lVar4 + -8;
  pcVar29[0] = -0x52;
  pcVar29[1] = 'H';
  pcVar29[2] = '\x11';
  pcVar29[3] = '\0';
  pcVar29[4] = '\0';
  pcVar29[5] = '\0';
  pcVar29[6] = '\0';
  pcVar29[7] = '\0';
  sVar14 = snd_pcm_info_sizeof();
  lVar5 = -(sVar14 + 0xf & 0xfffffffffffffff0);
  __s = pcVar13 + lVar5;
  local_98 = __s;
  __s[-8] = -0x30;
  __s[-7] = 'H';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  memset(__s,0,sVar14);
  __s[-8] = -0x28;
  __s[-7] = 'H';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar9 = snd_card_next(&local_88);
  local_48 = alsaApi;
  if (local_88 < 0 || iVar9 != 0) {
    ctl = (snd_ctl_t *)0x1;
    local_40 = (HwDevInfo *)0x0;
    pPVar31 = (PaAlsaDeviceInfo *)0x0;
  }
  else {
    ctl = (snd_ctl_t *)0x1;
    local_38 = 0;
    pPVar31 = (PaAlsaDeviceInfo *)0x0;
    local_40 = (HwDevInfo *)0x0;
    do {
      local_64 = -1;
      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"AI\x11",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      snprintf(local_158,0x32,"hw:%d");
      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"OI\x11",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      iVar9 = snd_ctl_open(&cardName,local_158,0);
      pcVar15 = cardName;
      if (iVar9 < 0) {
        uVar17 = 6;
      }
      else {
        builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"jI\x11",4);
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        snd_ctl_card_info(pcVar15,pcVar13);
        builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"rI\x11",4);
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        pcVar15 = (char *)snd_ctl_card_info_get_name(pcVar13);
        __s[-8] = -0x7f;
        __s[-7] = 'I';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(alsaApi,(char **)&cardIdx,pcVar15);
        pcVar15 = cardName;
        if (paUtilErr_ < 0) {
          builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\bM\x11",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1329\n"
                           );
          uVar17 = 10;
          local_38 = (ulong)(uint)paUtilErr_;
        }
        else {
          __s[-8] = -100;
          __s[-7] = 'I';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar9 = snd_ctl_pcm_next_device(pcVar15,&local_64);
          pcVar15 = local_98;
          if (-1 < local_64 && iVar9 == 0) {
            do {
              __s[-8] = -0x1f;
              __s[-7] = 'I';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              snprintf((char *)&local_118,0x43,"%s%s,%d",local_b0,local_158);
              iVar9 = local_64;
              __s[-8] = -0x14;
              __s[-7] = 'I';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              snd_pcm_info_set_device(pcVar15,iVar9);
              __s[-8] = -10;
              __s[-7] = 'I';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              snd_pcm_info_set_subdevice(pcVar15,0);
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x03J\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              snd_pcm_info_set_stream(pcVar15,1);
              pcVar3 = cardName;
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x0fJ\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              uVar10 = snd_ctl_pcm_info(pcVar3,pcVar15);
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x1cJ\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              snd_pcm_info_set_stream(pcVar15,0);
              pcVar3 = cardName;
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"(J\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              uVar11 = snd_ctl_pcm_info(pcVar3);
              if ((int)(uVar11 & uVar10) < 0) {
                uVar17 = 0xb;
              }
              else {
                local_90 = (PaAlsaDeviceInfo *)CONCAT44(local_90._4_4_,uVar11);
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"?J\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                pbVar16 = (byte *)snd_pcm_info_get_name();
                pbVar7 = _cardIdx;
                bVar1 = *_cardIdx;
                pbVar25 = _cardIdx;
                while (bVar1 != 0) {
                  bVar1 = *pbVar16;
                  pbVar30 = pbVar16;
                  for (; (bVar1 != 0 && (pbVar30 = pbVar30 + 1, bVar1 == *pbVar25));
                      pbVar25 = pbVar25 + 1) {
                    bVar1 = *pbVar30;
                    if ((bVar1 & 0xdf) == 0) {
                      pbVar16 = pbVar30;
                    }
                  }
                  do {
                    bVar1 = *pbVar25;
                    if (bVar1 == 0) break;
                    pbVar25 = pbVar25 + 1;
                  } while (bVar1 != 0x20);
                  bVar1 = *pbVar25;
                }
                pbVar25 = (byte *)"-";
                if (*pbVar16 != 0) {
                  for (; bVar1 = *pbVar16, bVar1 == 0x20; pbVar16 = pbVar16 + 1) {
                  }
                  if ((bVar1 == 0x2d) || (pbVar25 = pbVar16, bVar1 == 0x3a)) {
                    pbVar25 = pbVar16 + (ulong)(pbVar16[1] == 0x20) * 2;
                  }
                }
                _uStack_60 = (PaAlsaDeviceInfo *)CONCAT44(devIdx_1,uVar10);
                pPStack_50 = pPVar31;
                __s[-8] = -0x12;
                __s[-7] = 'J';
                __s[-6] = '\x11';
                __s[-5] = '\0';
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                iVar9 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar7,pbVar25,&local_118);
                pPVar2 = local_48->allocations;
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x06K\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar9 + 1));
                pbVar16 = _cardIdx;
                if (pcVar15 == (char *)0x0) {
                  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"+L\x11",4);
                  __s[-4] = '\0';
                  __s[-3] = '\0';
                  __s[-2] = '\0';
                  __s[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1365\n"
                                   );
                  local_38 = 0xffffd8f8;
                  uVar17 = 10;
                  pcVar15 = local_98;
                  alsaApi = local_48;
                  pPVar31 = pPStack_50;
                }
                else {
                  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"/K\x11",4);
                  __s[-4] = '\0';
                  __s[-3] = '\0';
                  __s[-2] = '\0';
                  __s[-1] = '\0';
                  snprintf(pcVar15,(long)(iVar9 + 1),"%s: %s (%s)",pbVar16,pbVar25,&local_118);
                  pHVar26 = local_40;
                  pPVar31 = (PaAlsaDeviceInfo *)
                            ((long)&(pPStack_50->baseDeviceInfo).structVersion + 1);
                  if ((local_40 == (HwDevInfo *)0x0) || (psVar6 = ctl, ctl < pPVar31)) {
                    psVar6 = (snd_ctl_t *)((long)ctl * 2);
                    sVar14 = (long)ctl << 6;
                    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"YK\x11",4);
                    __s[-4] = '\0';
                    __s[-3] = '\0';
                    __s[-2] = '\0';
                    __s[-1] = '\0';
                    local_40 = (HwDevInfo *)realloc(pHVar26,sVar14);
                    if (local_40 == (HwDevInfo *)0x0) {
                      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"}L\x11",4);
                      __s[-4] = '\0';
                      __s[-3] = '\0';
                      __s[-2] = '\0';
                      __s[-1] = '\0';
                      PaUtil_DebugPrint(
                                       "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1375\n"
                                       );
                      local_38 = 0xffffd8f8;
                      uVar17 = 10;
                      local_40 = (HwDevInfo *)0x0;
                      pcVar15 = local_98;
                      alsaApi = local_48;
                      ctl = psVar6;
                      goto LAB_00114be2;
                    }
                  }
                  ctl = psVar6;
                  alsaApi = local_48;
                  __s[-8] = -0x79;
                  __s[-7] = 'K';
                  __s[-6] = '\x11';
                  __s[-5] = '\0';
                  __s[-4] = '\0';
                  __s[-3] = '\0';
                  __s[-2] = '\0';
                  __s[-1] = '\0';
                  paUtilErr_ = PaAlsa_StrDup(alsaApi,(char **)(buf + 0x40),(char *)&local_118);
                  if (paUtilErr_ < 0) {
                    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"[L\x11",4);
                    __s[-4] = '\0';
                    __s[-3] = '\0';
                    __s[-2] = '\0';
                    __s[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1378\n"
                                     );
                    uVar17 = 10;
                    local_38 = (ulong)(uint)paUtilErr_;
                    pcVar15 = local_98;
                  }
                  else {
                    local_40[(long)pPStack_50].alsaName = stack0xffffffffffffff30;
                    local_40[(long)pPStack_50].name = pcVar15;
                    local_40[(long)pPStack_50].isPlug = topNode._4_4_;
                    local_40[(long)pPStack_50].hasPlayback = ~(uint)local_90 >> 0x1f;
                    local_40[(long)pPStack_50].hasCapture = ~uStack_60 >> 0x1f;
                    uVar17 = 0;
                    pcVar15 = local_98;
                  }
                }
              }
LAB_00114be2:
              pcVar3 = cardName;
              if (((int)uVar17 != 0xb) && ((int)uVar17 != 0)) goto LAB_00114cd3;
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x03L\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              iVar9 = snd_ctl_pcm_next_device(pcVar3,&local_64);
            } while ((iVar9 == 0) && (-1 < local_64));
          }
          pcVar15 = cardName;
          __s[-8] = -0x47;
          __s[-7] = 'L';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          snd_ctl_close(pcVar15);
          pbVar16 = _cardIdx;
          pPVar2 = alsaApi->allocations;
          __s[-8] = -0x36;
          __s[-7] = 'L';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          PaUtil_GroupFreeMemory(pPVar2,pbVar16);
          uVar17 = 0;
        }
      }
LAB_00114cd3:
      iVar9 = (int)uVar17;
      if ((iVar9 != 0) && (iVar9 != 6)) {
        if (iVar9 == 10) goto LAB_00115232;
        goto LAB_001153b3;
      }
      __s[-8] = -0x17;
      __s[-7] = 'L';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      iVar9 = snd_card_next(&local_88);
    } while ((iVar9 == 0) && (-1 < local_88));
  }
  if (_snd_config == 0) {
    __s[-8] = -0x24;
    __s[-7] = 'P';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar9 = snd_config_update();
    iVar12 = 0;
    if (iVar9 < 0) {
      __s[-8] = -0xe;
      __s[-7] = 'S';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      BuildDeviceList_cold_1();
      local_38 = 0xffffd8f1;
      iVar12 = 10;
    }
    if (iVar12 != 10) {
      uVar17 = local_38;
      if (iVar12 != 0) goto LAB_001153b3;
      goto LAB_00114d39;
    }
LAB_00115232:
    pPVar22 = (PaAlsaDeviceInfo *)0x0;
    goto LAB_00115379;
  }
LAB_00114d39:
  if (_snd_config == 0) {
    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"$T\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    __assert_fail("*alsa_snd_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x575,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)");
  }
  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"XM\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar9 = snd_config_search(_snd_config,"pcm",&local_a8);
  uVar21 = local_a8;
  if (-1 < iVar9) {
    pPStack_50 = pPVar31;
    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"pM\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    lVar18 = snd_config_iterator_first(uVar21);
    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"{M\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    lVar19 = snd_config_iterator_next(lVar18);
    uVar21 = local_a8;
    __s[-8] = -0x76;
    __s[-7] = 'M';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    lVar20 = snd_config_iterator_end(uVar21);
    if (lVar18 != lVar20) {
      do {
        local_118 = "unknown";
        _cardIdx = (byte *)0x0;
        __s[-8] = -0x47;
        __s[-7] = 'M';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        uVar21 = snd_config_iterator_entry(lVar18);
        cardName = (char *)0x0;
        __s[-8] = -0x2d;
        __s[-7] = 'M';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        iVar9 = snd_config_search(uVar21,"type",&cardName);
        pcVar13 = cardName;
        if (iVar9 < 0) {
          if (iVar9 == -2) goto LAB_00114e07;
          builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"dO\x11",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          __thread1 = pthread_self();
          builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"vO\x11",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar12 = pthread_equal(__thread1,paUnixMainThread);
          if (iVar12 != 0) {
            __s[-8] = -0x7c;
            __s[-7] = 'O';
            __s[-6] = '\x11';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            pcVar13 = (char *)snd_strerror(iVar9);
            __s[-8] = -0x6c;
            __s[-7] = 'O';
            __s[-6] = '\x11';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar9,pcVar13);
          }
          __s[-8] = -0x5e;
          __s[-7] = 'O';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1415\n"
                           );
          local_38 = 0xffffd8f1;
LAB_00114fa7:
          iVar12 = 10;
        }
        else {
          __s[-8] = -0x19;
          __s[-7] = 'M';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar9 = snd_config_get_string(pcVar13,&local_118);
          iVar12 = 0;
          if (iVar9 < 0) {
            builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"DP\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            BuildDeviceList_cold_2();
            local_38 = 0xffffd8f1;
            iVar12 = 10;
          }
          if (-1 < iVar9) {
LAB_00114e07:
            builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x13N\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            iVar9 = snd_config_get_id(uVar21,&cardIdx);
            pbVar16 = _cardIdx;
            if (iVar9 < 0) {
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"^P\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              BuildDeviceList_cold_3();
              local_38 = 0xffffd8f1;
              iVar12 = 10;
            }
            else {
              builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"7N\x11",4);
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              pcVar13 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
              if (pcVar13 != (char *)0x0) {
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"DN\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                iVar9 = atoi(pcVar13);
                iVar12 = 0x17;
                if (iVar9 != 0) goto LAB_0011500b;
              }
              lVar18 = 0;
              do {
                pcVar13 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar18);
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"_N\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                iVar9 = strcmp((char *)pbVar16,pcVar13);
                if (iVar9 == 0) {
                  iVar12 = 0x17;
                  goto LAB_0011500b;
                }
                lVar18 = lVar18 + 8;
              } while (lVar18 != 0x50);
              pPVar2 = alsaApi->allocations;
              __s[-8] = -0x7f;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              sVar14 = strlen((char *)pbVar16);
              __s[-8] = -0x73;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar14 + 6);
              pbVar16 = _cardIdx;
              if (pcVar13 == (char *)0x0) {
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x7fP\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                PaUtil_DebugPrint(
                                 "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
                                 );
                local_38 = 0xffffd8f8;
                goto LAB_00114fa7;
              }
              __s[-8] = -0x5b;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              strcpy(pcVar13,(char *)pbVar16);
              pbVar16 = _cardIdx;
              pPVar2 = alsaApi->allocations;
              __s[-8] = -0x4a;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              sVar14 = strlen((char *)pbVar16);
              __s[-8] = -0x3e;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar14 + 1);
              pbVar16 = _cardIdx;
              if (pcVar15 == (char *)0x0) {
                __s[-8] = -0x69;
                __s[-7] = 'P';
                __s[-6] = '\x11';
                __s[-5] = '\0';
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                PaUtil_DebugPrint(
                                 "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
                                 );
                local_38 = 0xffffd8f8;
                iVar12 = 10;
                alsaApi = local_48;
                goto LAB_0011500b;
              }
              __s[-8] = -0x26;
              __s[-7] = 'N';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              strcpy(pcVar15,(char *)pbVar16);
              pHVar26 = local_40;
              _uStack_60 = (PaAlsaDeviceInfo *)
                           ((long)&(pPStack_50->baseDeviceInfo).structVersion + 1);
              if ((local_40 == (HwDevInfo *)0x0) || (psVar6 = ctl, ctl < _uStack_60)) {
                psVar6 = (snd_ctl_t *)((long)ctl * 2);
                sVar14 = (long)ctl << 6;
                builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\aO\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                local_40 = (HwDevInfo *)realloc(pHVar26,sVar14);
                if (local_40 != (HwDevInfo *)0x0) goto LAB_00114f18;
                __s[-8] = -0x48;
                __s[-7] = 'P';
                __s[-6] = '\x11';
                __s[-5] = '\0';
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                PaUtil_DebugPrint(
                                 "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1442\n"
                                 );
                local_38 = 0xffffd8f8;
                iVar12 = 10;
                local_40 = (HwDevInfo *)0x0;
                ctl = psVar6;
              }
              else {
LAB_00114f18:
                ctl = psVar6;
                if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_00114fb9:
                  pHVar26 = (HwDevInfo *)0x0;
                }
                else {
                  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"3O\x11",4);
                  __s[-4] = '\0';
                  __s[-3] = '\0';
                  __s[-2] = '\0';
                  __s[-1] = '\0';
                  iVar9 = strcmp(pcVar13,predefinedNames[0].alsaName);
                  pHVar26 = predefinedNames;
                  if (iVar9 != 0) {
                    pHVar26 = predefinedNames;
                    do {
                      pcVar3 = pHVar26[1].alsaName;
                      if (pcVar3 == (char *)0x0) goto LAB_00114fb9;
                      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"UO\x11",4);
                      __s[-4] = '\0';
                      __s[-3] = '\0';
                      __s[-2] = '\0';
                      __s[-1] = '\0';
                      iVar9 = strcmp(pcVar13,pcVar3);
                      pHVar26 = pHVar26 + 1;
                    } while (iVar9 != 0);
                  }
                }
                local_40[(long)pPStack_50].alsaName = pcVar13;
                local_40[(long)pPStack_50].name = pcVar15;
                local_40[(long)pPStack_50].isPlug = 1;
                if (pHVar26 == (HwDevInfo *)0x0) {
                  local_40[(long)pPStack_50].hasPlayback = 1;
                  local_40[(long)pPStack_50].hasCapture = 1;
                }
                else {
                  local_40[(long)pPStack_50].hasPlayback = pHVar26->hasPlayback;
                  local_40[(long)pPStack_50].hasCapture = pHVar26->hasCapture;
                }
                iVar12 = 0;
              }
              pPStack_50 = _uStack_60;
              alsaApi = local_48;
            }
          }
        }
LAB_0011500b:
        if ((iVar12 != 0x17) && (iVar12 != 0)) goto LAB_001150fe;
        builtin_strncpy(local_158 + lVar5 + lVar4 + -8," P\x11",4);
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        lVar20 = snd_config_iterator_next(lVar19);
        uVar21 = local_a8;
        builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"/P\x11",4);
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        lVar18 = snd_config_iterator_end(uVar21);
        bVar32 = lVar19 != lVar18;
        lVar18 = lVar19;
        lVar19 = lVar20;
      } while (bVar32);
    }
    iVar12 = 0;
LAB_001150fe:
    pPVar31 = pPStack_50;
    if (iVar12 == 10) goto LAB_00115232;
    uVar17 = local_38;
    if (iVar12 != 0) goto LAB_001153b3;
  }
  pPVar2 = alsaApi->allocations;
  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"%Q\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  pPVar22 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,0x18);
  (pPVar22->baseDeviceInfo).name = (char *)0xffffffffffffffff;
  pPVar2 = alsaApi->allocations;
  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"EQ\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  pvVar23 = PaUtil_GroupAllocateMemory(pPVar2,(long)pPVar31 * 8);
  *(void **)&pPVar22->baseDeviceInfo = pvVar23;
  if (pvVar23 == (void *)0x0) {
    pcVar13 = 
    "Expression \'out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1474\n"
    ;
LAB_001153d6:
    pPVar31 = (PaAlsaDeviceInfo *)0x0;
    __s[-8] = -0x20;
    __s[-7] = 'S';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    PaUtil_DebugPrint(pcVar13);
    local_38 = 0xffffd8f8;
    goto LAB_00115379;
  }
  pPVar2 = alsaApi->allocations;
  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"bQ\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  pPVar24 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)pPVar31 * 0x70);
  if (pPVar24 == (PaAlsaDeviceInfo *)0x0) {
    pcVar13 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1478\n"
    ;
    goto LAB_001153d6;
  }
  local_54 = 0;
  _uStack_60 = pPVar22;
  local_90 = pPVar24;
  pPStack_50 = pPVar31;
  pHVar26 = local_40;
  for (; pPVar31 != (PaAlsaDeviceInfo *)0x0; pPVar31 = (PaAlsaDeviceInfo *)&pPVar31[-1].field_0x6f)
  {
    pcVar13 = pHVar26->name;
    __s[-8] = -0x59;
    __s[-7] = 'Q';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    uVar10 = strcmp(pcVar13,"dmix");
    uVar17 = (ulong)uVar10;
    iVar9 = 0x2a;
    if (uVar10 != 0) {
      __s[-8] = -0x40;
      __s[-7] = 'Q';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      uVar11 = strcmp(pcVar13,"default");
      pPVar8 = local_48;
      pPVar22 = _uStack_60;
      uVar10 = local_84;
      uVar17 = (ulong)uVar11;
      if (uVar11 != 0) {
        __s[-8] = -0x22;
        __s[-7] = 'Q';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        paUtilErr_ = FillInDevInfo(pPVar8,pHVar26,uVar10,pPVar24,&local_54,
                                   (PaLinuxScanDeviceInfosResults *)pPVar22);
        uVar17 = (ulong)(uint)paUtilErr_;
        iVar9 = 0;
        if (paUtilErr_ < 0) {
          builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x17R\x11",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1498\n"
                           );
          iVar9 = 10;
          uVar17 = (ulong)(uint)paUtilErr_;
          local_38 = uVar17;
        }
      }
    }
    if ((iVar9 != 0) && (iVar9 != 0x2a)) goto LAB_00115368;
    pHVar26 = pHVar26 + 1;
    pPVar24 = pPVar24 + 1;
  }
  pPVar31 = local_90;
  pPVar22 = pPStack_50;
  alsaApi = local_48;
  pHVar26 = local_40;
  pPVar24 = pPStack_50;
  if (pPStack_50 < (PaAlsaDeviceInfo *)(long)local_54) {
    *(code **)(__s + -8) = PaAlsa_StrDup;
    __assert_fail("devIdx <= numDeviceNames",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x5dc,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)");
  }
  for (; pPStack_50 = pPVar22, local_48 = alsaApi, pPVar24 != (PaAlsaDeviceInfo *)0x0;
      pPVar24 = (PaAlsaDeviceInfo *)&pPVar24[-1].field_0x6f) {
    pcVar13 = pHVar26->name;
    builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"tR\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar9 = strcmp(pcVar13,"dmix");
    if (iVar9 == 0) {
LAB_00115290:
      pPVar8 = local_48;
      pPVar22 = _uStack_60;
      uVar10 = local_84;
      __s[-8] = -0x56;
      __s[-7] = 'R';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      paUtilErr_ = FillInDevInfo(pPVar8,pHVar26,uVar10,pPVar31,&local_54,
                                 (PaLinuxScanDeviceInfosResults *)pPVar22);
      uVar17 = (ulong)(uint)paUtilErr_;
      iVar9 = 0;
      if (paUtilErr_ < 0) {
        __s[-8] = -0x20;
        __s[-7] = 'R';
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        PaUtil_DebugPrint(
                         "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1511\n"
                         );
        iVar9 = 10;
        uVar17 = (ulong)(uint)paUtilErr_;
        local_38 = uVar17;
      }
    }
    else {
      __s[-8] = -0x79;
      __s[-7] = 'R';
      __s[-6] = '\x11';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      uVar10 = strcmp(pcVar13,"default");
      uVar17 = (ulong)uVar10;
      iVar9 = 0x2f;
      if (uVar10 == 0) goto LAB_00115290;
    }
    if ((iVar9 != 0) && (iVar9 != 0x2f)) goto LAB_00115368;
    pPVar31 = pPVar31 + 1;
    pPVar22 = pPStack_50;
    alsaApi = local_48;
    pHVar26 = pHVar26 + 1;
  }
  if (pPVar22 != (PaAlsaDeviceInfo *)0x0) {
    ppcVar27 = &local_40->name;
    do {
      pPVar2 = alsaApi->allocations;
      pcVar13 = *ppcVar27;
      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\x16S\x11",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      PaUtil_GroupFreeMemory(pPVar2,pcVar13);
      pPVar2 = alsaApi->allocations;
      pcVar13 = ((HwDevInfo *)(ppcVar27 + -1))->alsaName;
      builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"\'S\x11",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      PaUtil_GroupFreeMemory(pPVar2,pcVar13);
      ppcVar27 = ppcVar27 + 4;
      pPVar22 = (PaAlsaDeviceInfo *)&pPVar22[-1].field_0x6f;
    } while (pPVar22 != (PaAlsaDeviceInfo *)0x0);
  }
  pHVar26 = local_40;
  builtin_strncpy(local_158 + lVar5 + lVar4 + -8,"9S\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  free(pHVar26);
  (_uStack_60->baseDeviceInfo).hostApi = local_54;
  *scanResults = _uStack_60;
  *count = local_54;
  pPVar31 = local_90;
LAB_00115398:
  uVar17 = local_38;
  if (pPVar31 != (PaAlsaDeviceInfo *)0x0) {
    pPVar2 = alsaApi->allocations;
    __s[-8] = -0x53;
    __s[-7] = 'S';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    PaUtil_GroupFreeMemory(pPVar2,pPVar31);
    uVar17 = local_38;
  }
LAB_001153b3:
  local_38 = uVar17;
  return (PaError)local_38;
LAB_00115368:
  pPVar22 = _uStack_60;
  alsaApi = local_48;
  pPVar31 = local_90;
  if (iVar9 != 10) goto LAB_001153b3;
LAB_00115379:
  iVar9 = local_54;
  if (pPVar22 != (PaAlsaDeviceInfo *)0x0) {
    pPVar2 = alsaApi->allocations;
    deviceInfos = *(PaDeviceInfo ***)&pPVar22->baseDeviceInfo;
    __s[-8] = -0x6f;
    __s[-7] = 'S';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    FreeDeviceInfos(pPVar2,deviceInfos,iVar9);
    *(undefined8 *)&pPVar22->baseDeviceInfo = 0;
  }
  goto LAB_00115398;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi, void** scanResults, int* count)
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif
    PaLinuxScanDeviceInfosResults* out = NULL;

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[67];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
        PaUtil_GroupFreeMemory( alsaApi->allocations, cardName );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    out = (PaLinuxScanDeviceInfosResults *) PaUtil_GroupAllocateMemory(
                            alsaApi->allocations, sizeof(PaLinuxScanDeviceInfosResults) );

    out->defaultInputDevice = paNoDevice;
    out->defaultOutputDevice = paNoDevice;

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }

    for( i = 0; i < numDeviceNames; ++i )
    {
        HwDevInfo* hwInfo = &hwDevInfos[i];
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->name );
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->alsaName );
    }
    free( hwDevInfos );

    out->deviceCount = devIdx;   /* Number of successfully queried devices */
    *scanResults = out;
    *count = out->deviceCount;

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    if( deviceInfoArray )
    {
        PaUtil_GroupFreeMemory( alsaApi->allocations, deviceInfoArray );
    }

    return result;

error:
    if( out )
    {
        FreeDeviceInfos( alsaApi->allocations, out->deviceInfos, devIdx );
        out->deviceInfos = NULL;
    }

    goto end;
}